

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

char * __thiscall cmGeneratorTarget::GetProperty(cmGeneratorTarget *this,string *prop)

{
  bool bVar1;
  TargetType tgtType;
  cmMessenger *pcVar2;
  char *pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  tgtType = cmTarget::GetType(this->Target);
  pcVar2 = cmMakefile::GetMessenger(this->Makefile);
  GetBacktrace((cmGeneratorTarget *)&stack0xffffffffffffffc8);
  bVar1 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,prop,pcVar2,(cmListFileBacktrace *)&stack0xffffffffffffffc8);
  if ((cmMakefile *)local_30._M_pi != (cmMakefile *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  if (bVar1) {
    pcVar2 = cmMakefile::GetMessenger(this->Makefile);
    GetBacktrace((cmGeneratorTarget *)&stack0xffffffffffffffc8);
    pcVar3 = cmTargetPropertyComputer::GetProperty<cmGeneratorTarget>
                       (this,prop,pcVar2,(cmListFileBacktrace *)&stack0xffffffffffffffc8);
    if ((cmMakefile *)local_30._M_pi != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
    }
    if (pcVar3 != (char *)0x0) {
      return pcVar3;
    }
    if ((cmSystemTools::s_FatalErrorOccured == false) &&
       (bVar1 = cmSystemTools::GetInterruptFlag(), !bVar1)) {
      pcVar3 = cmTarget::GetProperty(this->Target,prop);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* cmGeneratorTarget::GetProperty(const std::string& prop) const
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->GetBacktrace())) {
    return nullptr;
  }
  if (const char* result = cmTargetPropertyComputer::GetProperty(
        this, prop, this->Makefile->GetMessenger(), this->GetBacktrace())) {
    return result;
  }
  if (cmSystemTools::GetFatalErrorOccured()) {
    return nullptr;
  }
  return this->Target->GetProperty(prop);
}